

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::interp::FuncType,_std::default_delete<wabt::interp::FuncType>_> __thiscall
wabt::
MakeUnique<wabt::interp::FuncType,std::vector<wabt::Type,std::allocator<wabt::Type>>,std::vector<wabt::Type,std::allocator<wabt::Type>>>
          (wabt *this,vector<wabt::Type,_std::allocator<wabt::Type>_> *args,
          vector<wabt::Type,_std::allocator<wabt::Type>_> *args_1)

{
  FuncType *this_00;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_68;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_48;
  
  this_00 = (FuncType *)operator_new(0x40);
  local_48._M_impl.super__Vector_impl_data._M_start =
       (args->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_48._M_impl.super__Vector_impl_data._M_finish =
       (args->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
       (args->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (args->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (args->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start =
       (args_1->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_68._M_impl.super__Vector_impl_data._M_finish =
       (args_1->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage =
       (args_1->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (args_1->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (args_1->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  interp::FuncType::FuncType(this_00,(ValueTypes *)&local_48,(ValueTypes *)&local_68);
  *(FuncType **)this = this_00;
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_68);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_48);
  return (__uniq_ptr_data<wabt::interp::FuncType,_std::default_delete<wabt::interp::FuncType>,_true,_true>
          )(__uniq_ptr_data<wabt::interp::FuncType,_std::default_delete<wabt::interp::FuncType>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}